

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strex.cc
# Opt level: O0

int ASN1_STRING_print_ex_fp(FILE *fp,ASN1_STRING *str,ulong flags)

{
  BIO *pBStack_30;
  int ret;
  BIO *bio;
  unsigned_long flags_local;
  ASN1_STRING *str_local;
  FILE *fp_local;
  
  pBStack_30 = (BIO *)0x0;
  if ((fp == (FILE *)0x0) || (pBStack_30 = BIO_new_fp(fp,0), pBStack_30 != (BIO *)0x0)) {
    fp_local._4_4_ = ASN1_STRING_print_ex(pBStack_30,str,flags);
    BIO_free(pBStack_30);
  }
  else {
    fp_local._4_4_ = -1;
  }
  return fp_local._4_4_;
}

Assistant:

int ASN1_STRING_print_ex_fp(FILE *fp, const ASN1_STRING *str,
                            unsigned long flags) {
  BIO *bio = NULL;
  if (fp != NULL) {
    // If |fp| is NULL, this function returns the number of bytes without
    // writing.
    bio = BIO_new_fp(fp, BIO_NOCLOSE);
    if (bio == NULL) {
      return -1;
    }
  }
  int ret = ASN1_STRING_print_ex(bio, str, flags);
  BIO_free(bio);
  return ret;
}